

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.h
# Opt level: O3

char * __thiscall
btPoint2PointConstraint::serialize
          (btPoint2PointConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i;
  long lVar1;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x40) = (this->m_pivotInA).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x50) = (this->m_pivotInB).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return "btPoint2PointConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btPoint2PointConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btPoint2PointConstraintData2* p2pData = (btPoint2PointConstraintData2*)dataBuffer;

	btTypedConstraint::serialize(&p2pData->m_typeConstraintData,serializer);
	m_pivotInA.serialize(p2pData->m_pivotInA);
	m_pivotInB.serialize(p2pData->m_pivotInB);

	return btPoint2PointConstraintDataName;
}